

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.hh
# Opt level: O0

void __thiscall SSM::DeviceException::DeviceException(DeviceException *this,string *msg)

{
  string local_38;
  string *local_18;
  string *msg_local;
  DeviceException *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)msg);
  Exception::Exception(&this->super_Exception,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__DeviceException_00118cf0;
  return;
}

Assistant:

DeviceException(std::string msg) : Exception(msg) {}